

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O3

NodeId __thiscall anon_unknown.dwarf_1a982c5::Scenario::NewPeer(Scenario *this)

{
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar1;
  NodeId ret;
  uint64_t local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    local_20 = RandomMixin<FastRandomContext>::randbits
                         (&this->m_rng->super_RandomMixin<FastRandomContext>,0x3f);
    pVar1 = std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
            _M_insert_unique<long_const&>
                      ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&this->m_runner->peerset,(long *)&local_20);
  } while (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

NodeId NewPeer()
    {
        bool ok;
        NodeId ret;
        do {
            ret = m_rng.randbits(63);
            ok = m_runner.peerset.insert(ret).second;
        } while(!ok);
        return ret;
    }